

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ClassFinalize(void)

{
  SystemToolsTranslationMap *pSVar1;
  
  pSVar1 = TranslationMap;
  if (TranslationMap != (SystemToolsTranslationMap *)0x0) {
    SystemToolsTranslationMap::~SystemToolsTranslationMap(TranslationMap);
    operator_delete(pSVar1,0x30);
  }
  pSVar1 = LongPathMap;
  if (LongPathMap != (SystemToolsTranslationMap *)0x0) {
    SystemToolsTranslationMap::~SystemToolsTranslationMap(LongPathMap);
    operator_delete(pSVar1,0x30);
  }
  return;
}

Assistant:

void SystemTools::ClassFinalize()
{
  delete SystemTools::TranslationMap;
  delete SystemTools::LongPathMap;
#ifdef __CYGWIN__
  delete SystemTools::Cyg2Win32Map;
#endif
}